

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-writer2.hpp
# Opt level: O2

int __thiscall
mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLW2_NLFeeder_C_Impl>_>::
WriteStringVec2File(NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLW2_NLFeeder_C_Impl>_>
                    *this,string *name,function<void_(mp::StringFileWriter_&)> *swf)

{
  int iVar1;
  int lMax;
  StringFileWriter sw;
  int local_9c;
  TOpener local_98;
  anon_class_40_2_9bb43b96 local_78;
  StringFileWriter local_50;
  
  local_9c = 0;
  std::__cxx11::string::string((string *)&local_78,(string *)name);
  local_78.this = this;
  std::function<mp::File(bool)>::
  function<mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,mp::NLW2_NLFeeder_C_Impl>>::WriteStringVec2File(std::__cxx11::string_const&,std::function<void(mp::StringFileWriter&)>)::_lambda(bool)_1_,void>
            ((function<mp::File(bool)> *)&local_98,&local_78);
  StringFileWriter::StringFileWriter(&local_50,&local_9c,&local_98);
  std::_Function_base::~_Function_base(&local_98.super__Function_base);
  std::__cxx11::string::~string((string *)&local_78);
  std::function<void_(mp::StringFileWriter_&)>::operator()(swf,&local_50);
  iVar1 = local_9c;
  StringFileWriter::~StringFileWriter(&local_50);
  return iVar1;
}

Assistant:

int NLWriter2<Params>::WriteStringVec2File(
    const std::string& name, std::function<void(StringFileWriter&)> swf) {
  int lMax=0;
  StringFileWriter sw(lMax,
                      [name, this](bool fClose){
    return Utils().openf(name.c_str(),
                         fClose, "w");
  });
  swf(sw);
  return lMax;
}